

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O1

int WebRtcIsac_EncodeLb(TransformTables *transform_tables,float *in,ISACLBEncStruct *ISACencLB_obj,
                       int16_t codingMode,int16_t bottleneckIndex)

{
  IsacSaveEncoderData *encData;
  double dVar1;
  double dVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  double *pdVar12;
  double *pdVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  int16_t AvgPitchGain_Q12;
  double dVar17;
  double dVar18;
  int16_t PitchGains_Q12 [4];
  double PitchGains [4];
  double PitchLags [4];
  transcode_obj transcodingParam;
  double hifilt_coef [42];
  int16_t fim [240];
  int16_t fre [240];
  double lofilt_coef [78];
  float HP [240];
  float LP [240];
  double LP_lookahead_pf [264];
  double HP_lookahead [240];
  double LPw_pf [240];
  double HPw [240];
  double LPw [240];
  double LP_lookahead [240];
  uint local_3e08;
  short local_3dd0 [4];
  double local_3dc8;
  int16_t *local_3dc0;
  ulong local_3db8;
  ulong local_3db0;
  double local_3da8 [4];
  double local_3d88 [4];
  double local_3d68 [6];
  double local_3d38 [6];
  uint32_t local_3d08;
  uint32_t local_3d04;
  uint local_3d00;
  uint8_t local_3cfc;
  uint8_t local_3cfb;
  uint8_t local_3cfa;
  double local_3cf8 [42];
  int16_t local_3ba8 [240];
  int16_t local_39c8 [240];
  double local_37e8 [78];
  float local_3578 [240];
  float local_31b8 [240];
  int local_2df8 [528];
  double local_25b8 [240];
  double local_1e38 [240];
  double local_16b8 [240];
  double local_f38 [240];
  double local_7b8 [241];
  
  iVar11 = ISACencLB_obj->buffer_index;
  if ((long)iVar11 == 0) {
    ISACencLB_obj->current_framesamples = ISACencLB_obj->new_framelength;
  }
  iVar16 = (int)ISACencLB_obj->current_framesamples;
  lVar14 = 0;
  do {
    ISACencLB_obj->data_buffer_float[iVar11 + lVar14] = in[lVar14];
    lVar14 = lVar14 + 1;
  } while (lVar14 != 0xa0);
  if (iVar11 + 0xa0 == 0x1e0) {
    ISACencLB_obj->buffer_index = 0;
    uVar8 = iVar16 + 0x3bfU & 0xffff;
    if ((uVar8 < 0x77f) || (ISACencLB_obj->frame_nb == 0)) {
      (ISACencLB_obj->bitstr_obj).W_upper = 0xffffffff;
      (ISACencLB_obj->bitstr_obj).streamval = 0;
      (ISACencLB_obj->bitstr_obj).stream_index = 0;
      if ((codingMode == 0) && ((uVar8 < 0x77f && (ISACencLB_obj->enforceFrameSize == 0)))) {
        iVar11 = WebRtcIsac_GetNewFrameLength(ISACencLB_obj->bottleneck,iVar16);
        ISACencLB_obj->new_framelength = (int16_t)iVar11;
      }
      dVar17 = WebRtcIsac_GetSnr(ISACencLB_obj->bottleneck,(int)ISACencLB_obj->current_framesamples)
      ;
      ISACencLB_obj->s2nr = dVar17;
      iVar11 = WebRtcIsac_EncodeFrameLen
                         (ISACencLB_obj->current_framesamples,&ISACencLB_obj->bitstr_obj);
      if (iVar11 < 0) {
        return iVar11;
      }
      (ISACencLB_obj->SaveEnc_obj).framelength = ISACencLB_obj->current_framesamples;
      ISACencLB_obj->lastBWIdx = bottleneckIndex;
      local_2df8[0] = (int)bottleneckIndex;
      WebRtcIsac_EncodeReceiveBw(local_2df8,&ISACencLB_obj->bitstr_obj);
    }
    else {
      iVar11 = 0;
    }
    WebRtcIsac_SplitAndFilterFloat
              (ISACencLB_obj->data_buffer_float,local_31b8,local_3578,local_7b8,local_25b8,
               &ISACencLB_obj->prefiltbankstr_obj);
    WebRtcIsac_PitchAnalysis
              (local_7b8,(double *)local_2df8,&ISACencLB_obj->pitchanalysisstr_obj,local_3d88,
               local_3da8);
    lVar14 = 0;
    do {
      local_3dd0[lVar14] = (short)(int)(local_3da8[lVar14] * 4096.0);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 4);
    uVar9 = 0;
    if (0x77e < uVar8) {
      uVar9 = (uint)(ISACencLB_obj->frame_nb != 0);
    }
    encData = &ISACencLB_obj->SaveEnc_obj;
    (ISACencLB_obj->SaveEnc_obj).startIdx = uVar9;
    WebRtcIsac_EncodePitchGain(local_3dd0,&ISACencLB_obj->bitstr_obj,encData);
    WebRtcIsac_EncodePitchLag(local_3d88,local_3dd0,&ISACencLB_obj->bitstr_obj,encData);
    pdVar13 = local_37e8;
    WebRtcIsac_GetLpcCoefLb
              ((double *)local_2df8,local_25b8,&ISACencLB_obj->maskfiltstr_obj,ISACencLB_obj->s2nr,
               local_3dd0,pdVar13,local_3cf8);
    WebRtcIsac_EncodeLpcLb(pdVar13,local_3cf8,&ISACencLB_obj->bitstr_obj,encData);
    lVar14 = 0;
    do {
      local_3da8[lVar14] = (double)((float)(int)local_3dd0[lVar14] * 0.00024414062);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 4);
    uVar3 = (ISACencLB_obj->bitstr_obj).W_upper;
    pdVar12 = local_3d68;
    local_3d08 = uVar3;
    uVar9 = (ISACencLB_obj->bitstr_obj).stream_index;
    local_3d00 = uVar9;
    uVar4 = (ISACencLB_obj->bitstr_obj).streamval;
    local_3d04 = uVar4;
    local_3db0 = (ulong)(uVar9 - 2);
    local_3cfc = (ISACencLB_obj->bitstr_obj).stream[local_3db0];
    local_3db8 = (ulong)(uVar9 - 1);
    local_3cfb = (ISACencLB_obj->bitstr_obj).stream[local_3db8];
    local_3cfa = (ISACencLB_obj->bitstr_obj).stream[uVar9];
    lVar14 = 0;
    do {
      *pdVar12 = *pdVar13;
      pdVar12[6] = local_3cf8[lVar14];
      lVar14 = lVar14 + 7;
      pdVar13 = pdVar13 + 0xd;
      pdVar12 = pdVar12 + 1;
    } while (lVar14 != 0x2a);
    WebRtcIsac_EncodeLpcGainLb(local_37e8,local_3cf8,&ISACencLB_obj->bitstr_obj,encData);
    local_3e08 = iVar16 - 0x3c0U & 0xffff;
    if (((iVar16 - 0x3c0U & 0xffff) < 0x3c0) && (ISACencLB_obj->frame_nb == 0)) {
      uVar8 = (uint)(int)ISACencLB_obj->payloadLimitBytes60 >> 1;
    }
    else {
      if (uVar8 < 0x77f) {
        uVar8._0_2_ = ISACencLB_obj->payloadLimitBytes30;
        uVar8._2_2_ = ISACencLB_obj->payloadLimitBytes60;
      }
      else {
        uVar8 = (uint)(ushort)ISACencLB_obj->payloadLimitBytes60;
      }
      uVar8 = uVar8 - 3;
    }
    WebRtcIsac_NormLatticeFilterMa
              (0xc,(ISACencLB_obj->maskfiltstr_obj).PreStateLoF,
               (ISACencLB_obj->maskfiltstr_obj).PreStateLoG,local_31b8,local_37e8,local_f38);
    WebRtcIsac_NormLatticeFilterMa
              (6,(ISACencLB_obj->maskfiltstr_obj).PreStateHiF,
               (ISACencLB_obj->maskfiltstr_obj).PreStateHiG,local_3578,local_3cf8,local_16b8);
    WebRtcIsac_PitchfilterPre
              (local_f38,local_1e38,&ISACencLB_obj->pitchfiltstr_obj,local_3d88,local_3da8);
    WebRtcIsac_Time2Spec
              (transform_tables,local_1e38,local_16b8,local_39c8,local_3ba8,
               &ISACencLB_obj->fftstr_obj);
    lVar14 = (long)(ISACencLB_obj->SaveEnc_obj).startIdx;
    memcpy((ISACencLB_obj->SaveEnc_obj).fre + lVar14 * 0xf0,local_39c8,0x1e0);
    memcpy((ISACencLB_obj->SaveEnc_obj).fim + lVar14 * 0xf0,local_3ba8,0x1e0);
    AvgPitchGain_Q12 =
         (int16_t)((uint)((int)local_3dd0[3] + (int)local_3dd0[2] +
                         (int)local_3dd0[1] + (int)local_3dd0[0]) >> 2);
    (ISACencLB_obj->SaveEnc_obj).AvgPitchGain[(ISACencLB_obj->SaveEnc_obj).startIdx] =
         AvgPitchGain_Q12;
    iVar15 = 0;
    iVar16 = WebRtcIsac_EncodeSpec
                       (local_39c8,local_3ba8,AvgPitchGain_Q12,kIsacLowerBand,
                        &ISACencLB_obj->bitstr_obj);
    if (iVar16 == -0x1928 || -1 < iVar16) {
      local_3dc8 = (double)((uVar8 & 0xffff) - uVar9);
      dVar17 = local_3dc8 / 600.0;
      local_3dc0 = (ISACencLB_obj->SaveEnc_obj).fim;
      iVar7 = iVar11;
      iVar10 = iVar16;
      do {
        iVar16 = iVar7;
        uVar5 = (ISACencLB_obj->bitstr_obj).stream_index;
        if ((uVar5 < (uVar8 & 0xffff) || uVar5 == (uVar8 & 0xffff)) && (iVar10 != -0x1928)) {
          if (local_3e08 < 0x3c0) {
            if (ISACencLB_obj->frame_nb == 1) {
              ISACencLB_obj->frame_nb = 0;
              if ((codingMode == 0) && (ISACencLB_obj->enforceFrameSize == 0)) {
                iVar11 = WebRtcIsac_GetNewFrameLength
                                   (ISACencLB_obj->bottleneck,
                                    (int)ISACencLB_obj->current_framesamples);
                ISACencLB_obj->new_framelength = (int16_t)iVar11;
              }
            }
            else if (ISACencLB_obj->frame_nb == 0) {
              ISACencLB_obj->frame_nb = 1;
              goto LAB_0015432b;
            }
          }
          else {
            ISACencLB_obj->frame_nb = 0;
          }
          iVar11 = WebRtcIsac_EncTerminate(&ISACencLB_obj->bitstr_obj);
          return iVar11;
        }
        if (iVar15 < 5) {
          dVar18 = dVar17 * 0.5;
          if (iVar10 != -0x1928) {
            dVar18 = local_3dc8 / (double)(uVar5 - uVar9);
          }
          dVar18 = (((double)iVar15 * -0.9) / 5.0 + 1.0) * dVar18;
          pdVar13 = local_3d68;
          pdVar12 = local_37e8;
          lVar14 = 0;
          do {
            dVar1 = *pdVar13;
            *pdVar12 = dVar1 * dVar18;
            dVar2 = pdVar13[6];
            local_3cf8[lVar14] = dVar2 * dVar18;
            *pdVar13 = dVar1 * dVar18;
            pdVar13[6] = dVar2 * dVar18;
            lVar14 = lVar14 + 7;
            pdVar12 = pdVar12 + 0xd;
            pdVar13 = pdVar13 + 1;
          } while (lVar14 != 0x2a);
          lVar14 = 0;
          do {
            local_39c8[lVar14] = (int16_t)(int)((double)(int)local_39c8[lVar14] * dVar18);
            local_3ba8[lVar14] = (int16_t)(int)((double)(int)local_3ba8[lVar14] * dVar18);
            lVar14 = lVar14 + 1;
          } while (lVar14 != 0xf0);
          lVar14 = (long)(ISACencLB_obj->SaveEnc_obj).startIdx;
          memcpy((ISACencLB_obj->SaveEnc_obj).fre + lVar14 * 0xf0,local_39c8,0x1e0);
          memcpy(local_3dc0 + lVar14 * 0xf0,local_3ba8,0x1e0);
          (ISACencLB_obj->bitstr_obj).W_upper = uVar3;
          (ISACencLB_obj->bitstr_obj).stream_index = uVar9;
          (ISACencLB_obj->bitstr_obj).streamval = uVar4;
          (ISACencLB_obj->bitstr_obj).stream[local_3db0] = local_3cfc;
          (ISACencLB_obj->bitstr_obj).stream[local_3db8] = local_3cfb;
          (ISACencLB_obj->bitstr_obj).stream[uVar9] = local_3cfa;
          WebRtcIsac_EncodeLpcGainLb(local_37e8,local_3cf8,&ISACencLB_obj->bitstr_obj,encData);
          iVar10 = WebRtcIsac_EncodeSpec
                             (local_39c8,local_3ba8,AvgPitchGain_Q12,kIsacLowerBand,
                              &ISACencLB_obj->bitstr_obj);
          if (iVar10 == -0x1928 || -1 < iVar10) {
            iVar15 = iVar15 + 1;
            bVar6 = true;
          }
          else {
            if ((local_3e08 < 0x3c0) && (ISACencLB_obj->frame_nb == 1)) {
              ISACencLB_obj->frame_nb = 0;
            }
            bVar6 = false;
            iVar16 = iVar10;
          }
        }
        else {
          if (local_3e08 < 0x3c0) {
            if (ISACencLB_obj->frame_nb == 1) {
              ISACencLB_obj->frame_nb = 0;
              goto LAB_00154a33;
            }
            if (ISACencLB_obj->frame_nb != 0) goto LAB_00154a33;
            ISACencLB_obj->frame_nb = 1;
            iVar16 = 0;
          }
          else {
LAB_00154a33:
            iVar16 = -0x1932;
            if (iVar10 == -0x1928) {
              iVar16 = iVar11;
            }
          }
          bVar6 = false;
        }
        iVar7 = iVar16;
      } while (bVar6);
    }
    else if ((local_3e08 < 0x3c0) && (ISACencLB_obj->frame_nb == 1)) {
      ISACencLB_obj->frame_nb = 0;
    }
  }
  else {
    ISACencLB_obj->buffer_index = iVar11 + 0xa0;
LAB_0015432b:
    iVar16 = 0;
  }
  return iVar16;
}

Assistant:

int WebRtcIsac_EncodeLb(const TransformTables* transform_tables,
                        float* in, ISACLBEncStruct* ISACencLB_obj,
                        int16_t codingMode,
                        int16_t bottleneckIndex) {
  int stream_length = 0;
  int err;
  int k;
  int iterCntr;

  double lofilt_coef[(ORDERLO + 1)*SUBFRAMES];
  double hifilt_coef[(ORDERHI + 1)*SUBFRAMES];
  float LP[FRAMESAMPLES_HALF];
  float HP[FRAMESAMPLES_HALF];

  double LP_lookahead[FRAMESAMPLES_HALF];
  double HP_lookahead[FRAMESAMPLES_HALF];
  double LP_lookahead_pf[FRAMESAMPLES_HALF + QLOOKAHEAD];
  double LPw[FRAMESAMPLES_HALF];

  double HPw[FRAMESAMPLES_HALF];
  double LPw_pf[FRAMESAMPLES_HALF];
  int16_t fre[FRAMESAMPLES_HALF];   /* Q7 */
  int16_t fim[FRAMESAMPLES_HALF];   /* Q7 */

  double PitchLags[4];
  double PitchGains[4];
  int16_t PitchGains_Q12[4];
  int16_t AvgPitchGain_Q12;

  int frame_mode; /* 0 for 30ms, 1 for 60ms */
  int status = 0;
  int my_index;
  transcode_obj transcodingParam;
  double bytesLeftSpecCoding;
  uint16_t payloadLimitBytes;

  /* Copy new frame-length and bottleneck rate only for the first 10 ms data */
  if (ISACencLB_obj->buffer_index == 0) {
    /* Set the framelength for the next packet. */
    ISACencLB_obj->current_framesamples = ISACencLB_obj->new_framelength;
  }
  /* 'frame_mode' is 0 (30 ms) or 1 (60 ms). */
  frame_mode = ISACencLB_obj->current_framesamples / MAX_FRAMESAMPLES;

  /* buffer speech samples (by 10ms packet) until the frame-length */
  /* is reached (30 or 60 ms).                                     */
  /*****************************************************************/

  /* fill the buffer with 10ms input data */
  for (k = 0; k < FRAMESAMPLES_10ms; k++) {
    ISACencLB_obj->data_buffer_float[k + ISACencLB_obj->buffer_index] = in[k];
  }

  /* If buffersize is not equal to current framesize then increase index
   * and return. We do no encoding untill we have enough audio.  */
  if (ISACencLB_obj->buffer_index + FRAMESAMPLES_10ms != FRAMESAMPLES) {
    ISACencLB_obj->buffer_index += FRAMESAMPLES_10ms;
    return 0;
  }
  /* If buffer reached the right size, reset index and continue with
   * encoding the frame. */
  ISACencLB_obj->buffer_index = 0;

  /* End of buffer function. */
  /**************************/

  /* Encoding */
  /************/

  if (frame_mode == 0 || ISACencLB_obj->frame_nb == 0) {
    /* This is to avoid Linux warnings until we change 'int' to 'Word32'
     * at all places. */
    int intVar;
    /* reset bitstream */
    WebRtcIsac_ResetBitstream(&(ISACencLB_obj->bitstr_obj));

    if ((codingMode == 0) && (frame_mode == 0) &&
        (ISACencLB_obj->enforceFrameSize == 0)) {
      ISACencLB_obj->new_framelength = WebRtcIsac_GetNewFrameLength(
          ISACencLB_obj->bottleneck, ISACencLB_obj->current_framesamples);
    }

    ISACencLB_obj->s2nr = WebRtcIsac_GetSnr(
        ISACencLB_obj->bottleneck, ISACencLB_obj->current_framesamples);

    /* Encode frame length. */
    status = WebRtcIsac_EncodeFrameLen(
        ISACencLB_obj->current_framesamples, &ISACencLB_obj->bitstr_obj);
    if (status < 0) {
      /* Wrong frame size. */
      return status;
    }
    /* Save framelength for multiple packets memory. */
    ISACencLB_obj->SaveEnc_obj.framelength =
        ISACencLB_obj->current_framesamples;

    /* To be used for Redundant Coding. */
    ISACencLB_obj->lastBWIdx = bottleneckIndex;
    intVar = (int)bottleneckIndex;
    WebRtcIsac_EncodeReceiveBw(&intVar, &ISACencLB_obj->bitstr_obj);
  }

  /* Split signal in two bands. */
  WebRtcIsac_SplitAndFilterFloat(ISACencLB_obj->data_buffer_float, LP, HP,
                                 LP_lookahead, HP_lookahead,
                                 &ISACencLB_obj->prefiltbankstr_obj);

  /* estimate pitch parameters and pitch-filter lookahead signal */
  WebRtcIsac_PitchAnalysis(LP_lookahead, LP_lookahead_pf,
                           &ISACencLB_obj->pitchanalysisstr_obj, PitchLags,
                           PitchGains);

  /* Encode in FIX Q12. */

  /* Convert PitchGain to Fixed point. */
  for (k = 0; k < PITCH_SUBFRAMES; k++) {
    PitchGains_Q12[k] = (int16_t)(PitchGains[k] * 4096.0);
  }

  /* Set where to store data in multiple packets memory. */
  if (frame_mode == 0 || ISACencLB_obj->frame_nb == 0) {
    ISACencLB_obj->SaveEnc_obj.startIdx = 0;
  } else {
    ISACencLB_obj->SaveEnc_obj.startIdx = 1;
  }

  /* Quantize & encode pitch parameters. */
  WebRtcIsac_EncodePitchGain(PitchGains_Q12, &ISACencLB_obj->bitstr_obj,
                             &ISACencLB_obj->SaveEnc_obj);
  WebRtcIsac_EncodePitchLag(PitchLags, PitchGains_Q12,
                            &ISACencLB_obj->bitstr_obj,
                            &ISACencLB_obj->SaveEnc_obj);

  AvgPitchGain_Q12 = (PitchGains_Q12[0] + PitchGains_Q12[1] +
      PitchGains_Q12[2] + PitchGains_Q12[3]) >> 2;

  /* Find coefficients for perceptual pre-filters. */
  WebRtcIsac_GetLpcCoefLb(LP_lookahead_pf, HP_lookahead,
                          &ISACencLB_obj->maskfiltstr_obj, ISACencLB_obj->s2nr,
                          PitchGains_Q12, lofilt_coef, hifilt_coef);

  /* Code LPC model and shape - gains not quantized yet. */
  WebRtcIsac_EncodeLpcLb(lofilt_coef, hifilt_coef, &ISACencLB_obj->bitstr_obj,
                         &ISACencLB_obj->SaveEnc_obj);

  /* Convert PitchGains back to FLOAT for pitchfilter_pre. */
  for (k = 0; k < 4; k++) {
    PitchGains[k] = ((float)PitchGains_Q12[k]) / 4096;
  }

  /* Store the state of arithmetic coder before coding LPC gains. */
  transcodingParam.W_upper = ISACencLB_obj->bitstr_obj.W_upper;
  transcodingParam.stream_index = ISACencLB_obj->bitstr_obj.stream_index;
  transcodingParam.streamval = ISACencLB_obj->bitstr_obj.streamval;
  transcodingParam.stream[0] =
      ISACencLB_obj->bitstr_obj.stream[ISACencLB_obj->bitstr_obj.stream_index -
                                       2];
  transcodingParam.stream[1] =
      ISACencLB_obj->bitstr_obj.stream[ISACencLB_obj->bitstr_obj.stream_index -
                                       1];
  transcodingParam.stream[2] =
      ISACencLB_obj->bitstr_obj.stream[ISACencLB_obj->bitstr_obj.stream_index];

  /* Store LPC Gains before encoding them. */
  for (k = 0; k < SUBFRAMES; k++) {
    transcodingParam.loFiltGain[k] = lofilt_coef[(LPC_LOBAND_ORDER + 1) * k];
    transcodingParam.hiFiltGain[k] = hifilt_coef[(LPC_HIBAND_ORDER + 1) * k];
  }

  /* Code gains */
  WebRtcIsac_EncodeLpcGainLb(lofilt_coef, hifilt_coef,
                             &ISACencLB_obj->bitstr_obj,
                             &ISACencLB_obj->SaveEnc_obj);

  /* Get the correct value for the payload limit and calculate the
   * number of bytes left for coding the spectrum. */
  if ((frame_mode == 1) && (ISACencLB_obj->frame_nb == 0)) {
    /* It is a 60ms and we are in the first 30ms then the limit at
     * this point should be half of the assigned value. */
    payloadLimitBytes = ISACencLB_obj->payloadLimitBytes60 >> 1;
  } else if (frame_mode == 0) {
    /* It is a 30ms frame */
    /* Subract 3 because termination process may add 3 bytes. */
    payloadLimitBytes = ISACencLB_obj->payloadLimitBytes30 - 3;
  } else {
    /* This is the second half of a 60ms frame. */
    /* Subract 3 because termination process may add 3 bytes. */
    payloadLimitBytes = ISACencLB_obj->payloadLimitBytes60 - 3;
  }
  bytesLeftSpecCoding = payloadLimitBytes - transcodingParam.stream_index;

  /* Perceptual pre-filtering (using normalized lattice filter). */
  /* Low-band filtering. */
  WebRtcIsac_NormLatticeFilterMa(ORDERLO,
                                 ISACencLB_obj->maskfiltstr_obj.PreStateLoF,
                                 ISACencLB_obj->maskfiltstr_obj.PreStateLoG,
                                 LP, lofilt_coef, LPw);
  /* High-band filtering. */
  WebRtcIsac_NormLatticeFilterMa(ORDERHI,
                                 ISACencLB_obj->maskfiltstr_obj.PreStateHiF,
                                 ISACencLB_obj->maskfiltstr_obj.PreStateHiG,
                                 HP, hifilt_coef, HPw);
  /* Pitch filter. */
  WebRtcIsac_PitchfilterPre(LPw, LPw_pf, &ISACencLB_obj->pitchfiltstr_obj,
                            PitchLags, PitchGains);
  /* Transform */
  WebRtcIsac_Time2Spec(transform_tables,
                       LPw_pf, HPw, fre, fim, &ISACencLB_obj->fftstr_obj);

  /* Save data for multiple packets memory. */
  my_index = ISACencLB_obj->SaveEnc_obj.startIdx * FRAMESAMPLES_HALF;
  memcpy(&ISACencLB_obj->SaveEnc_obj.fre[my_index], fre, sizeof(fre));
  memcpy(&ISACencLB_obj->SaveEnc_obj.fim[my_index], fim, sizeof(fim));

  ISACencLB_obj->SaveEnc_obj.AvgPitchGain[ISACencLB_obj->SaveEnc_obj.startIdx] =
      AvgPitchGain_Q12;

  /* Quantization and loss-less coding. */
  err = WebRtcIsac_EncodeSpec(fre, fim, AvgPitchGain_Q12, kIsacLowerBand,
                              &ISACencLB_obj->bitstr_obj);
  if ((err < 0) && (err != -ISAC_DISALLOWED_BITSTREAM_LENGTH)) {
    /* There has been an error but it was not too large payload
       (we can cure too large payload). */
    if (frame_mode == 1 && ISACencLB_obj->frame_nb == 1) {
      /* If this is the second 30ms of a 60ms frame reset
         this such that in the next call encoder starts fresh. */
      ISACencLB_obj->frame_nb = 0;
    }
    return err;
  }
  iterCntr = 0;
  while ((ISACencLB_obj->bitstr_obj.stream_index > payloadLimitBytes) ||
      (err == -ISAC_DISALLOWED_BITSTREAM_LENGTH)) {
    double bytesSpecCoderUsed;
    double transcodeScale;

    if (iterCntr >= MAX_PAYLOAD_LIMIT_ITERATION) {
      /* We were not able to limit the payload size */
      if ((frame_mode == 1) && (ISACencLB_obj->frame_nb == 0)) {
        /* This was the first 30ms of a 60ms frame. Although
           the payload is larger than it should be but we let
           the second 30ms be encoded. Maybe together we
           won't exceed the limit. */
        ISACencLB_obj->frame_nb = 1;
        return 0;
      } else if ((frame_mode == 1) && (ISACencLB_obj->frame_nb == 1)) {
        ISACencLB_obj->frame_nb = 0;
      }

      if (err != -ISAC_DISALLOWED_BITSTREAM_LENGTH) {
        return -ISAC_PAYLOAD_LARGER_THAN_LIMIT;
      } else {
        return status;
      }
    }

    if (err == -ISAC_DISALLOWED_BITSTREAM_LENGTH) {
      bytesSpecCoderUsed = STREAM_SIZE_MAX;
      /* Being conservative */
      transcodeScale = bytesLeftSpecCoding / bytesSpecCoderUsed * 0.5;
    } else {
      bytesSpecCoderUsed = ISACencLB_obj->bitstr_obj.stream_index -
          transcodingParam.stream_index;
      transcodeScale = bytesLeftSpecCoding / bytesSpecCoderUsed;
    }

    /* To be safe, we reduce the scale depending on
       the number of iterations. */
    transcodeScale *= (1.0 - (0.9 * (double)iterCntr /
        (double)MAX_PAYLOAD_LIMIT_ITERATION));

    /* Scale the LPC Gains. */
    for (k = 0; k < SUBFRAMES; k++) {
      lofilt_coef[(LPC_LOBAND_ORDER + 1) * k] =
          transcodingParam.loFiltGain[k] * transcodeScale;
      hifilt_coef[(LPC_HIBAND_ORDER + 1) * k] =
          transcodingParam.hiFiltGain[k] * transcodeScale;
      transcodingParam.loFiltGain[k] = lofilt_coef[(LPC_LOBAND_ORDER + 1) * k];
      transcodingParam.hiFiltGain[k] = hifilt_coef[(LPC_HIBAND_ORDER + 1) * k];
    }

    /* Scale DFT coefficients. */
    for (k = 0; k < FRAMESAMPLES_HALF; k++) {
      fre[k] = (int16_t)(fre[k] * transcodeScale);
      fim[k] = (int16_t)(fim[k] * transcodeScale);
    }

    /* Save data for multiple packets memory. */
    my_index = ISACencLB_obj->SaveEnc_obj.startIdx * FRAMESAMPLES_HALF;
    memcpy(&ISACencLB_obj->SaveEnc_obj.fre[my_index], fre, sizeof(fre));
    memcpy(&ISACencLB_obj->SaveEnc_obj.fim[my_index], fim, sizeof(fim));

    /* Re-store the state of arithmetic coder before coding LPC gains. */
    ISACencLB_obj->bitstr_obj.W_upper = transcodingParam.W_upper;
    ISACencLB_obj->bitstr_obj.stream_index = transcodingParam.stream_index;
    ISACencLB_obj->bitstr_obj.streamval = transcodingParam.streamval;
    ISACencLB_obj->bitstr_obj.stream[transcodingParam.stream_index - 2] =
        transcodingParam.stream[0];
    ISACencLB_obj->bitstr_obj.stream[transcodingParam.stream_index - 1] =
        transcodingParam.stream[1];
    ISACencLB_obj->bitstr_obj.stream[transcodingParam.stream_index] =
        transcodingParam.stream[2];

    /* Code gains. */
    WebRtcIsac_EncodeLpcGainLb(lofilt_coef, hifilt_coef,
                               &ISACencLB_obj->bitstr_obj,
                               &ISACencLB_obj->SaveEnc_obj);

    /* Update the number of bytes left for encoding the spectrum. */
    bytesLeftSpecCoding = payloadLimitBytes - transcodingParam.stream_index;

    /* Encode the spectrum. */
    err = WebRtcIsac_EncodeSpec(fre, fim, AvgPitchGain_Q12, kIsacLowerBand,
                                &ISACencLB_obj->bitstr_obj);

    if ((err < 0) && (err != -ISAC_DISALLOWED_BITSTREAM_LENGTH)) {
      /* There has been an error but it was not too large
         payload (we can cure too large payload). */
      if (frame_mode == 1 && ISACencLB_obj->frame_nb == 1) {
        /* If this is the second 30 ms of a 60 ms frame reset
           this such that in the next call encoder starts fresh. */
        ISACencLB_obj->frame_nb = 0;
      }
      return err;
    }
    iterCntr++;
  }

  /* If 60 ms frame-size and just processed the first 30 ms, */
  /* go back to main function to buffer the other 30 ms speech frame. */
  if (frame_mode == 1) {
    if (ISACencLB_obj->frame_nb == 0) {
      ISACencLB_obj->frame_nb = 1;
      return 0;
    } else if (ISACencLB_obj->frame_nb == 1) {
      ISACencLB_obj->frame_nb = 0;
      /* Also update the frame-length for next packet,
         in Adaptive mode only. */
      if (codingMode == 0 && (ISACencLB_obj->enforceFrameSize == 0)) {
        ISACencLB_obj->new_framelength =
            WebRtcIsac_GetNewFrameLength(ISACencLB_obj->bottleneck,
                                         ISACencLB_obj->current_framesamples);
      }
    }
  } else {
    ISACencLB_obj->frame_nb = 0;
  }

  /* Complete arithmetic coding. */
  stream_length = WebRtcIsac_EncTerminate(&ISACencLB_obj->bitstr_obj);
  return stream_length;
}